

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_channel_map_find_channel_position
                    (ma_uint32 channels,ma_channel *pChannelMap,ma_channel channelPosition,
                    ma_uint32 *pChannelIndex)

{
  ma_channel mVar1;
  ulong uVar2;
  
  if (pChannelIndex != (ma_uint32 *)0x0) {
    *pChannelIndex = 0xffffffff;
  }
  if (channels != 0) {
    uVar2 = 0;
    do {
      if (pChannelMap == (ma_channel *)0x0) {
        mVar1 = ma_channel_map_init_standard_channel
                          (ma_standard_channel_map_default,channels,(ma_uint32)uVar2);
      }
      else {
        mVar1 = pChannelMap[uVar2];
      }
      if (mVar1 == channelPosition) {
        if (pChannelIndex == (ma_uint32 *)0x0) {
          return 1;
        }
        *pChannelIndex = (ma_uint32)uVar2;
        return 1;
      }
      uVar2 = uVar2 + 1;
    } while (channels != uVar2);
  }
  return 0;
}

Assistant:

MA_API ma_bool32 ma_channel_map_find_channel_position(ma_uint32 channels, const ma_channel* pChannelMap, ma_channel channelPosition, ma_uint32* pChannelIndex)
{
    ma_uint32 iChannel;

    if (pChannelIndex != NULL) {
        *pChannelIndex = (ma_uint32)-1;
    }

    for (iChannel = 0; iChannel < channels; ++iChannel) {
        if (ma_channel_map_get_channel(pChannelMap, channels, iChannel) == channelPosition) {
            if (pChannelIndex != NULL) {
                *pChannelIndex = iChannel;
            }

            return MA_TRUE;
        }
    }

    /* Getting here means the channel position was not found. */
    return MA_FALSE;
}